

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O3

CTcSrcFile * CTcSrcFile::open_ascii(char *filename)

{
  FILE *pFVar1;
  CTcSrcFile *pCVar2;
  CCharmapToUni *__s;
  CVmDataSource *pCVar3;
  
  pFVar1 = fopen(filename,"rb");
  if (pFVar1 == (FILE *)0x0) {
    pCVar2 = (CTcSrcFile *)0x0;
  }
  else {
    pCVar2 = (CTcSrcFile *)operator_new(0x430);
    __s = (CCharmapToUni *)operator_new(0x210);
    memset(__s,0,0x210);
    (__s->super_CCharmap).ref_cnt_ = 1;
    (__s->super_CCharmap)._vptr_CCharmap = (_func_int **)&PTR__CCharmap_0030a948;
    (pCVar2->super_CTcSrcObject)._vptr_CTcSrcObject = (_func_int **)&PTR__CTcSrcFile_003140d0;
    pCVar3 = (CVmDataSource *)operator_new(0x10);
    pCVar3->_vptr_CVmDataSource = (_func_int **)&PTR__CVmFileSource_003141a8;
    pCVar3[1]._vptr_CVmDataSource = (_func_int **)pFVar1;
    pCVar2->fp_ = pCVar3;
    pCVar2->field_0x8 = 0;
    pCVar2->rem_ = 0;
    pCVar2->mapper_ = __s;
  }
  return pCVar2;
}

Assistant:

CTcSrcFile *CTcSrcFile::open_ascii(const char *filename)
{
    osfildef *fp;

    /* 
     *   open the file in binary mode, since we do all of the newline
     *   interpretation explicitly 
     */
    if ((fp = osfoprb(filename, OSFTTEXT)) == 0)
        return 0;

    /* return a source reader with a plain ASCII mapper */
    return new CTcSrcFile(fp, new CCharmapToUniASCII());
}